

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.h
# Opt level: O0

vector<double,_std::allocator<double>_> *
polyscope::gather<double>
          (vector<double,_std::allocator<double>_> *input,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *perm)

{
  value_type vVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  reference pvVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  size_t i;
  vector<double,_std::allocator<double>_> *result;
  allocator_type *in_stack_ffffffffffffffa0;
  vector<double,_std::allocator<double>_> *this;
  size_type local_38;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX);
  if (sVar2 == 0) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8);
  }
  else {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX);
    this = (vector<double,_std::allocator<double>_> *)&stack0xffffffffffffffe6;
    geometrycentral::surface::std::allocator<double>::allocator((allocator<double> *)0x4113b7);
    std::vector<double,_std::allocator<double>_>::vector(this,sVar2,in_stack_ffffffffffffffa0);
    geometrycentral::surface::std::allocator<double>::~allocator((allocator<double> *)0x4113d7);
    local_38 = 0;
    while (sVar2 = local_38,
          sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX),
          sVar2 < sVar3) {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDX,local_38)
      ;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(ulong)*pvVar4);
      vVar1 = *pvVar5;
      pvVar6 = geometrycentral::surface::std::vector<double,_std::allocator<double>_>::operator[]
                         (in_RDI,local_38);
      *pvVar6 = vVar1;
      local_38 = local_38 + 1;
    }
  }
  return (vector<double,_std::allocator<double>_> *)in_RDI;
}

Assistant:

std::vector<T> gather(const std::vector<T>& input, const std::vector<uint32_t>& perm) {
  // TODO figure out if there's a copy to be avoided here
  if (perm.size() == 0) {
    return input;
  }
  std::vector<T> result(perm.size());
  for (size_t i = 0; i < perm.size(); i++) {
    result[i] = input[perm[i]];
  }
  return result;
}